

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall args::ArgumentParser::LongSeparator(ArgumentParser *this,string *longseparator_)

{
  pointer pcVar1;
  runtime_error *this_00;
  string errorMessage;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (longseparator_->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this->longseparator);
    local_38[0] = local_28;
    if (this->allowJoinedLongValue == true) {
      pcVar1 = (longseparator_->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_38,pcVar1,pcVar1 + longseparator_->_M_string_length);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_38," ","");
    }
    std::__cxx11::string::_M_assign((string *)&(this->helpParams).longSeparator);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
    return;
  }
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,"longseparator can not be set to empty","");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)local_38);
  *(undefined ***)this_00 = &PTR__runtime_error_004b3ea8;
  __cxa_throw(this_00,&UsageError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

typename std::enable_if<!IsConvertableToString<T>::value, std::string>::type
        ToString(const T &)
        {
            return {};
        }